

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

void trb_print_entire_node
               (trt_node *node,uint32_t max_gap_before_type,trt_wrapper wr,trt_printer_ctx *pc,
               trt_tree_ctx *tc)

{
  trt_pck_print ppck;
  trt_pck_indent ipck;
  int16_t iVar1;
  trt_indent_in_node tVar2;
  undefined4 uStack_64;
  undefined4 local_40;
  undefined8 local_34;
  trt_indent_in_node ind;
  trt_tree_ctx *tc_local;
  trt_printer_ctx *pc_local;
  uint32_t max_gap_before_type_local;
  trt_node *node_local;
  
  tVar2 = trp_default_indent_in_node(node);
  local_34 = tVar2._0_8_;
  local_40 = CONCAT22(local_40._2_2_,tVar2.btw_type_iffeatures);
  if ((max_gap_before_type != 0) && ((node->type).type != TRD_TYPE_EMPTY)) {
    iVar1 = trb_calc_btw_opts_type(node,(int16_t)max_gap_before_type);
    local_34 = CONCAT26(iVar1,tVar2._0_6_);
  }
  ipck._36_4_ = uStack_64;
  ipck.in_node._8_4_ = local_40;
  ppck.fps.print_features_names = (pc->fp).print.print_features_names;
  ppck.tree_ctx = tc;
  ppck.fps.print_keys = (pc->fp).print.print_keys;
  ipck.in_node.type = (undefined4)local_34;
  ipck.in_node.btw_name_opts = local_34._4_2_;
  ipck.in_node.btw_opts_type = local_34._6_2_;
  ipck.wrapper = wr;
  trp_print_entire_node(node,ppck,ipck,pc->max_line_length,pc->out);
  return;
}

Assistant:

static void
trb_print_entire_node(const struct trt_node *node, uint32_t max_gap_before_type, struct trt_wrapper wr,
        struct trt_printer_ctx *pc, struct trt_tree_ctx *tc)
{
    struct trt_indent_in_node ind = trp_default_indent_in_node(node);

    if ((max_gap_before_type > 0) && (node->type.type != TRD_TYPE_EMPTY)) {
        /* print actual node with unified indent */
        ind.btw_opts_type = trb_calc_btw_opts_type(node, max_gap_before_type);
    }
    /* after -> print actual node with default indent */
    trp_print_entire_node(node, TRP_INIT_PCK_PRINT(tc, pc->fp.print),
            TRP_INIT_PCK_INDENT(wr, ind), pc->max_line_length, pc->out);
}